

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_operator.cpp
# Opt level: O1

void __thiscall duckdb::LogicalOperator::Print(LogicalOperator *this)

{
  string local_28;
  
  (*this->_vptr_LogicalOperator[5])(&local_28,this,0);
  Printer::Print(&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  return;
}

Assistant:

void LogicalOperator::Print() {
	Printer::Print(ToString());
}